

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O1

void aspa_table_update_swap_in_consume(aspa_update **update_pointer,_Bool apply)

{
  undefined8 *puVar1;
  long lVar2;
  aspa_update *ptr;
  aspa_update_operation *paVar3;
  void *pvVar4;
  ulong uVar5;
  aspa_array *array;
  long lVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((update_pointer == (aspa_update **)0x0) || (ptr = *update_pointer, ptr == (aspa_update *)0x0))
  {
LAB_0010dcb6:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
  }
  else {
    if (apply) {
      if (((((pthread_rwlock_t *)ptr->table == (pthread_rwlock_t *)0x0) ||
           (ptr->operations == (aspa_update_operation *)0x0)) ||
          (ptr->node == (aspa_store_node *)0x0)) ||
         ((ptr->new_array == (aspa_array *)0x0 ||
          (ptr->failed_operation != (aspa_update_operation *)0x0)))) goto LAB_0010dcb6;
      array = ptr->node->aspa_array;
      pthread_rwlock_wrlock((pthread_rwlock_t *)ptr->table);
      ptr->node->aspa_array = ptr->new_array;
      pthread_rwlock_unlock((pthread_rwlock_t *)ptr->table);
    }
    else {
      array = (aspa_array *)0x0;
    }
    *update_pointer = (aspa_update *)0x0;
    pthread_rwlock_unlock((pthread_rwlock_t *)&ptr->table->update_lock);
    if (ptr->operation_count != 0) {
      lVar6 = 0;
      uVar5 = 0;
      do {
        paVar3 = ptr->operations;
        if (apply) {
          if ((&paVar3->is_no_op)[lVar6] == false) {
            aspa_table_notify_clients
                      (ptr->table,(aspa_record *)((long)&(paVar3->record).customer_asn + lVar6),
                       ptr->node->rtr_socket,(&paVar3->type)[lVar6]);
          }
          if (((&paVar3->is_no_op)[lVar6] == false) && ((&paVar3->type)[lVar6] == ASPA_REMOVE)) {
            pvVar4 = *(void **)((long)&(paVar3->record).provider_asns + lVar6);
            if (pvVar4 != (void *)0x0) {
              lrtr_free(pvVar4);
            }
            puVar1 = (undefined8 *)((long)&(paVar3->record).provider_count + lVar6);
            *puVar1 = 0;
            puVar1[1] = 0;
          }
        }
        else {
          if (ptr->failed_operation != (aspa_update_operation *)0x0 &&
              (aspa_update_operation *)((long)&paVar3->index + lVar6) == ptr->failed_operation)
          break;
          if (((&paVar3->is_no_op)[lVar6] == false) && ((&paVar3->type)[lVar6] == ASPA_ADD)) {
            pvVar4 = *(void **)((long)&(paVar3->record).provider_asns + lVar6);
            if (pvVar4 != (void *)0x0) {
              lrtr_free(pvVar4);
            }
            *(undefined8 *)((long)&(paVar3->record).provider_asns + lVar6) = 0;
          }
        }
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x30;
      } while (uVar5 < ptr->operation_count);
    }
    if ((apply) && (array != (aspa_array *)0x0)) {
      aspa_array_free(array,false);
    }
    if ((!apply) && (ptr->new_array != (aspa_array *)0x0)) {
      aspa_array_free(ptr->new_array,false);
    }
    if (ptr->operations != (aspa_update_operation *)0x0) {
      lrtr_free(ptr->operations);
    }
    ptr->node = (aspa_store_node *)0x0;
    ptr->new_array = (aspa_array *)0x0;
    ptr->operation_count = 0;
    ptr->failed_operation = (aspa_update_operation *)0x0;
    ptr->table = (aspa_table *)0x0;
    ptr->operations = (aspa_update_operation *)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      lrtr_free(ptr);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void aspa_table_update_swap_in_consume(struct aspa_update **update_pointer, const bool apply)
{
	// Not going to re-apply update or apply if computation failed
	if (!update_pointer)
		return;

	struct aspa_update *update = *update_pointer;

	if (!update)
		return;

	struct aspa_array *old_array = NULL;

	if (apply) {
		if (!update->table || !update->operations || !update->node || !update->new_array ||
		    !!update->failed_operation)
			return;

		old_array = update->node->aspa_array;
		pthread_rwlock_wrlock(&update->table->lock);
		update->node->aspa_array = update->new_array;
		pthread_rwlock_unlock(&update->table->lock);
	}

	// Prevent access
	*update_pointer = NULL;

	// MARK: Change Lock
	// We're done with the update, allow changes again.
	pthread_rwlock_unlock(&update->table->update_lock);

	// Handle notifications and cleanup...
	for (size_t i = 0; i < update->operation_count; i++) {
		struct aspa_update_operation *op = &update->operations[i];

		// TODO: @carl check if this can get optimized away
		if (apply) {
			// Notify clients
			// We can directly use the operation array as the source for the diff
			// so we don't need to rely on first notifying clients about all records
			// in the old_array being removed and then every record in the new_array
			// being added again.
#if ASPA_NOTIFY_NO_OPS
			aspa_table_notify_clients(update->table, &op->record, update->node->rtr_socket, op->type);
#else
			if (!op->is_no_op)
				aspa_table_notify_clients(update->table, &op->record, update->node->rtr_socket,
							  op->type);
#endif

			// If it's a remove operation, we need to deallocate the existing record's
			// provider array as it is no longer present in the new ASPA array.
			if (!op->is_no_op && op->type == ASPA_REMOVE) {
				if (op->record.provider_asns)
					lrtr_free(op->record.provider_asns);

				op->record.provider_asns = NULL;
				op->record.provider_count = 0;
			}
		} else {
			// No cleanup necessary for operations that haven't even been performed in the first place
			if (update->failed_operation && (op == update->failed_operation))
				break;

			// If it's an add operation, we need to deallocate the newly created record's
			// provider array as it is not needed
			if (!op->is_no_op && op->type == ASPA_ADD) {
				if (op->record.provider_asns)
					lrtr_free(op->record.provider_asns);

				op->record.provider_asns = NULL;
			}
		}
	}

	// Free
	if (apply && old_array)
		aspa_array_free(old_array, false);

	if (!apply && update->new_array)
		aspa_array_free(update->new_array, false);

	if (update->operations)
		lrtr_free(update->operations);

	update->operations = NULL;
	update->operation_count = 0;
	update->failed_operation = NULL;
	update->new_array = NULL;
	update->node = NULL;
	update->table = NULL;
	lrtr_free(update);
}